

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::compiler::Resolution>::addAll<kj::ArrayBuilder<capnp::compiler::Resolution>>
          (ArrayBuilder<capnp::compiler::Resolution> *this,
          ArrayBuilder<capnp::compiler::Resolution> *container)

{
  uint uVar1;
  Resolution *pRVar2;
  undefined8 uVar3;
  RemoveConst<capnp::compiler::Resolution> *pRVar4;
  anon_union_16_1_a8a2e026_for_OneOf<capnp::compiler::Resolution::Type,_capnp::compiler::Resolution::Member>_2
  *paVar5;
  Resolution *pRVar6;
  
  pRVar2 = container->pos;
  pRVar4 = this->pos;
  if (container->ptr != pRVar2) {
    paVar5 = &(container->ptr->target).field_1;
    do {
      uVar3 = *(undefined8 *)(paVar5 + -1);
      pRVar4->startByte = (int)uVar3;
      pRVar4->endByte = (int)((ulong)uVar3 >> 0x20);
      uVar1 = ((OneOf<capnp::compiler::Resolution::Type,_capnp::compiler::Resolution::Member> *)
              ((long)paVar5 + -8))->tag;
      (pRVar4->target).tag = uVar1;
      if (uVar1 == 2) {
        uVar3 = *(undefined8 *)((long)paVar5 + 8);
        *(undefined8 *)&(pRVar4->target).field_1 = *(undefined8 *)paVar5;
        *(undefined8 *)((long)&(pRVar4->target).field_1 + 8) = uVar3;
      }
      else if (uVar1 == 1) {
        *(undefined8 *)&(pRVar4->target).field_1 = *(undefined8 *)paVar5;
      }
      pRVar4 = pRVar4 + 1;
      pRVar6 = (Resolution *)(paVar5 + 1);
      paVar5 = paVar5 + 2;
    } while (pRVar6 != pRVar2);
  }
  this->pos = pRVar4;
  return;
}

Assistant:

inline T* begin() KJ_LIFETIMEBOUND { return ptr; }